

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O3

ktx_error_code_e
ktxTexture_CreateFromMemory
          (ktx_uint8_t *bytes,ktx_size_t size,ktxTextureCreateFlags createFlags,ktxTexture **newTex)

{
  ktx_error_code_e kVar1;
  ktxStream stream;
  ktxStream kStack_78;
  
  kVar1 = KTX_INVALID_VALUE;
  if (((size != 0) && (bytes != (ktx_uint8_t *)0x0)) && (newTex != (ktxTexture **)0x0)) {
    kVar1 = ktxMemStream_construct_ro(&kStack_78,bytes,size);
    if (kVar1 == KTX_SUCCESS) {
      kVar1 = ktxTexture_CreateFromStream(&kStack_78,createFlags,newTex);
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture_CreateFromMemory(const ktx_uint8_t* bytes, ktx_size_t size,
                            ktxTextureCreateFlags createFlags,
                            ktxTexture** newTex)
{
    KTX_error_code result;
    ktxStream stream;

    if (bytes == NULL || newTex == NULL || size == 0)
        return KTX_INVALID_VALUE;

    result = ktxMemStream_construct_ro(&stream, bytes, size);
    if (result == KTX_SUCCESS) {
        result = ktxTexture_CreateFromStream(&stream, createFlags, newTex);
    }
    return result;}